

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

void __thiscall rw::Geometry::correctTristripWinding(Geometry *this)

{
  uint16 uVar1;
  uint uVar2;
  MeshHeader *this_00;
  bool bVar3;
  MeshHeader *this_01;
  void *__src;
  Mesh *pMVar4;
  uint local_40;
  ushort local_3a;
  uint32 j;
  bool inStrip;
  uint16 i;
  Mesh *newmesh;
  Mesh *mesh;
  uint16 *indices;
  MeshHeader *newhead;
  MeshHeader *header;
  Geometry *this_local;
  
  this_00 = this->meshHeader;
  if ((((this->flags & 0x1000000) == 0) && (this_00 != (MeshHeader *)0x0)) && (this_00->flags == 1))
  {
    this->meshHeader = (MeshHeader *)0x0;
    this_01 = allocateMeshes(this,(uint)this_00->numMeshes,0,1);
    this_01->flags = this_00->flags;
    __src = mustmalloc_LOC((ulong)(this_00->totalIndices << 1) << 1,0x1000f,
                           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp line: 581"
                          );
    newmesh = MeshHeader::getMeshes(this_00);
    _j = MeshHeader::getMeshes(this_01);
    for (local_3a = 0; local_3a < this_00->numMeshes; local_3a = local_3a + 1) {
      _j->numIndices = 0;
      _j->indices = (uint16 *)((long)__src + (ulong)this_01->totalIndices * 2);
      _j->material = newmesh->material;
      bVar3 = false;
      for (local_40 = 0; local_40 < newmesh->numIndices - 2; local_40 = local_40 + 1) {
        if ((newmesh->indices[local_40] == newmesh->indices[local_40 + 1]) ||
           (newmesh->indices[local_40 + 1] == newmesh->indices[local_40 + 2])) {
          bVar3 = false;
        }
        else if ((!bVar3) && (bVar3 = true, (_j->numIndices & 1) != 0)) {
          _j->indices[_j->numIndices] = _j->indices[_j->numIndices - 1];
          _j->numIndices = _j->numIndices + 1;
        }
        uVar1 = newmesh->indices[local_40];
        uVar2 = _j->numIndices;
        _j->numIndices = uVar2 + 1;
        _j->indices[uVar2] = uVar1;
      }
      for (; local_40 < newmesh->numIndices; local_40 = local_40 + 1) {
        uVar1 = newmesh->indices[local_40];
        uVar2 = _j->numIndices;
        _j->numIndices = uVar2 + 1;
        _j->indices[uVar2] = uVar1;
      }
      this_01->totalIndices = _j->numIndices + this_01->totalIndices;
      newmesh = newmesh + 1;
      _j = _j + 1;
    }
    (*DAT_001660a8)(this_00);
    allocateMeshes(this,(uint)this_01->numMeshes,this_01->totalIndices,0);
    pMVar4 = MeshHeader::getMeshes(this->meshHeader);
    memcpy(pMVar4->indices,__src,(ulong)(this->meshHeader->totalIndices << 1));
    (*DAT_001660a8)(__src);
  }
  return;
}

Assistant:

void
Geometry::correctTristripWinding(void)
{
	MeshHeader *header = this->meshHeader;
	if(this->flags & NATIVE || header == nil ||
	   header->flags != MeshHeader::TRISTRIP)
		return;
	this->meshHeader = nil;
	// Allocate no indices, we realloc later
	MeshHeader *newhead = this->allocateMeshes(header->numMeshes, 0, 1);
	newhead->flags = header->flags;
	/* get a temporary working buffer */
	uint16 *indices = rwNewT(uint16, header->totalIndices*2,
		MEMDUR_FUNCTION | ID_GEOMETRY);

	Mesh *mesh = header->getMeshes();
	Mesh *newmesh = newhead->getMeshes();
	for(uint16 i = 0; i < header->numMeshes; i++){
		newmesh->numIndices = 0;
		newmesh->indices = &indices[newhead->totalIndices];
		newmesh->material = mesh->material;

		bool inStrip = 0;
		uint32 j;
		for(j = 0; j < mesh->numIndices-2; j++){
			/* Duplicate vertices indicate end of strip */
			if(mesh->indices[j] == mesh->indices[j+1] ||
			   mesh->indices[j+1] == mesh->indices[j+2])
				inStrip = 0;
			else if(!inStrip){
				/* Entering strip now,
				 * make sure winding is correct */
				inStrip = 1;
				if(newmesh->numIndices % 2){
					newmesh->indices[newmesh->numIndices] =
					  newmesh->indices[newmesh->numIndices-1];
					newmesh->numIndices++;
				}
			}
			newmesh->indices[newmesh->numIndices++] = mesh->indices[j];
		}
		for(; j < mesh->numIndices; j++)
			newmesh->indices[newmesh->numIndices++] = mesh->indices[j];
		newhead->totalIndices += newmesh->numIndices;

		mesh++;
		newmesh++;
	}
	rwFree(header);
	// Now allocate indices and copy them
	this->allocateMeshes(newhead->numMeshes, newhead->totalIndices, 0);
	memcpy(this->meshHeader->getMeshes()->indices, indices, this->meshHeader->totalIndices*2);
	rwFree(indices);
}